

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O3

Get_constant_factor_result __thiscall
lossless_neural_sound::expression_compiler::expression::Product::get_constant_factor
          (Product *this,Arena *arena,Nodes *nodes)

{
  Expression_node **__src;
  _func_int **pp_Var1;
  Expression_node *pEVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Get_constant_factor_result GVar5;
  vector<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
  factors;
  Expression_node **local_38;
  Expression_node **ppEStack_30;
  long local_28;
  
  uVar3 = 0;
  uVar4 = 0x3ff00000;
  pEVar2 = (Expression_node *)this;
  do {
    pEVar2 = (Expression_node *)pEVar2[1].super_Node._vptr_Node;
    if (pEVar2 == (Expression_node *)0x0) goto LAB_00118f09;
    pp_Var1 = (pEVar2->super_Node)._vptr_Node;
  } while (pp_Var1 == (_func_int **)&PTR__Node_001278e0);
  if (pp_Var1 == (_func_int **)&PTR__Node_00127750) {
    local_38 = (Expression_node **)0x0;
    ppEStack_30 = (Expression_node **)0x0;
    local_28 = 0;
    Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>::
    visit_leaves<lossless_neural_sound::expression_compiler::expression::Product::get_constant_factor(lossless_neural_sound::expression_compiler::Arena&,lossless_neural_sound::expression_compiler::expression::Nodes&)const::_lambda(lossless_neural_sound::expression_compiler::expression::Expression_node_const*)_1_>
              (&this->
                super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>
               ,(vector<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
                 *)&local_38);
    if ((ulong)((long)ppEStack_30 - (long)local_38) < 9) {
      __assert_fail("factors.size() >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/programmerjake[P]lossless_neural_sound/src/expression_compiler/expression.h"
                    ,0x4dd,
                    "virtual Get_constant_factor_result lossless_neural_sound::expression_compiler::expression::Product::get_constant_factor(Arena &, Nodes &) const"
                   );
    }
    if ((long)ppEStack_30 - (long)local_38 == 0x10) {
      pp_Var1 = pEVar2[1].super_Node._vptr_Node;
      uVar3 = SUB84(pp_Var1,0);
      uVar4 = (undefined4)((ulong)pp_Var1 >> 0x20);
      this = (Product *)ppEStack_30[-1];
    }
    else {
      __src = local_38 + 1;
      if (__src != ppEStack_30) {
        memmove(local_38,__src,(long)ppEStack_30 - (long)__src);
      }
      ppEStack_30 = ppEStack_30 + -1;
      pp_Var1 = pEVar2[1].super_Node._vptr_Node;
      this = (Product *)
             Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>::
             make_tree<>(arena,nodes,local_38,(long)ppEStack_30 - (long)local_38 >> 3);
      uVar3 = SUB84(pp_Var1,0);
      uVar4 = (undefined4)((ulong)pp_Var1 >> 0x20);
    }
    if (local_38 != (Expression_node **)0x0) {
      operator_delete(local_38,local_28 - (long)local_38);
    }
  }
LAB_00118f09:
  GVar5.constant_factor._4_4_ = uVar4;
  GVar5.constant_factor._0_4_ = uVar3;
  GVar5.rest = (Expression_node *)this;
  return GVar5;
}

Assistant:

virtual Get_constant_factor_result get_constant_factor(Arena &arena,
                                                           Nodes &nodes) const override
    {
        auto *front = left_node;
        while(auto *node = dynamic_cast<const Product *>(front))
            front = node->left_node;
        if(auto *constant = dynamic_cast<const Constant *>(front))
        {
            std::vector<const Expression_node *> factors;
            visit_leaves([&](const Expression_node *factor)
                         {
                             factors.push_back(factor);
                         });
            assert(factors.size() >= 2);
            if(factors.size() == 2)
                return {constant->value, factors.back()};
            factors.erase(factors.begin());
            return {constant->value, make_tree(arena, nodes, factors.data(), factors.size())};
        }
        return {1, this};
    }